

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

float64 vector_maha_precomp(float32 *var,int32 len)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  if (len < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = log((double)(float)var[uVar1]);
      dVar3 = dVar3 - dVar2;
      var[uVar1] = (float32)(1.0 / ((float)var[uVar1] + (float)var[uVar1]));
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return (float64)(((double)len * -1.8378770664093453 + dVar3) * 0.5);
}

Assistant:

float64
vector_maha_precomp(float32 * var, int32 len)
{
    float64 det;
    int32 i;

    for (det = (float64) 0.0, i = 0; i < len; i++) {    /* log(1.0/prod(var[i])) */
        det -= (float64) (log(var[i]));
        var[i] = (float32) (1.0 / (var[i] * 2.0));
    }
    det -= log(2.0 * M_PI) * len;

    return (det * 0.5);         /* sqrt */
}